

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstatsindex.cpp
# Opt level: O0

void anon_unknown.dwarf_193474c::DBVal::Unser<DataStream>(DataStream *s,DBVal *obj)

{
  long lVar1;
  undefined8 in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ::(anonymous_namespace)::DBVal::
  SerializationOps<DataStream,(anonymous_namespace)::DBVal,ActionUnserialize>(in_RSI,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(DBVal, obj)
    {
        READWRITE(obj.muhash);
        READWRITE(obj.transaction_output_count);
        READWRITE(obj.bogo_size);
        READWRITE(obj.total_amount);
        READWRITE(obj.total_subsidy);
        READWRITE(obj.total_unspendable_amount);
        READWRITE(obj.total_prevout_spent_amount);
        READWRITE(obj.total_new_outputs_ex_coinbase_amount);
        READWRITE(obj.total_coinbase_amount);
        READWRITE(obj.total_unspendables_genesis_block);
        READWRITE(obj.total_unspendables_bip30);
        READWRITE(obj.total_unspendables_scripts);
        READWRITE(obj.total_unspendables_unclaimed_rewards);
    }